

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.c
# Opt level: O3

int put_pitch(int p)

{
  size_t sVar1;
  char result [8];
  char local_10 [8];
  
  sprintf(local_10,"%s%d",
          put_pitch_ptos_rel + *(int *)(put_pitch_ptos_rel + (ulong)((uint)p % 0xc) * 4),
          (ulong)((uint)p / 0xc - 1));
  puts(local_10);
  sVar1 = strlen(local_10);
  return (int)sVar1;
}

Assistant:

private int put_pitch(int p)
{
    char result[8];
    static char *ptos[] = {
        "c", "cs", "d", "ef", "e", "f", "fs", "g",
        "gs", "a", "bf", "b"    };
    /* note octave correction below */
    sprintf(result, "%s%d", ptos[p % 12], (p / 12) - 1);
    printf("%s\n", result);
    return (int)strlen(result);
}